

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O3

StringRef __thiscall llvm::Twine::toNullTerminatedStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  NodeKind NVar1;
  size_t sVar2;
  char *__s;
  StringRef SVar3;
  char local_9;
  
  NVar1 = this->LHSKind;
  if (EmptyKind < NVar1 && this->RHSKind == EmptyKind) {
    if (NVar1 == StdStringKind) {
      __s = (char *)*(this->LHS).decUL;
      sVar2 = (this->LHS).decUL[1];
      goto LAB_0016bff8;
    }
    if (NVar1 == CStringKind) {
      __s = (this->LHS).cString;
      if (__s == (char *)0x0) {
        sVar2 = 0;
        __s = (char *)0x0;
      }
      else {
        sVar2 = strlen(__s);
      }
      goto LAB_0016bff8;
    }
  }
  toVector(this,Out);
  local_9 = '\0';
  SmallVectorTemplateBase<char,_true>::push_back
            (&Out->super_SmallVectorTemplateBase<char,_true>,&local_9);
  sVar2 = (ulong)(Out->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - 1;
  if ((Out->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity < sVar2) {
    __assert_fail("Size <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  (Out->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = (uint)sVar2;
  __s = (char *)(Out->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
LAB_0016bff8:
  SVar3.Length = sVar2;
  SVar3.Data = __s;
  return SVar3;
}

Assistant:

StringRef Twine::toNullTerminatedStringRef(SmallVectorImpl<char> &Out) const {
  if (isUnary()) {
    switch (getLHSKind()) {
    case CStringKind:
      // Already null terminated, yay!
      return StringRef(LHS.cString);
    case StdStringKind: {
      const std::string *str = LHS.stdString;
      return StringRef(str->c_str(), str->size());
    }
    default:
      break;
    }
  }
  toVector(Out);
  Out.push_back(0);
  Out.pop_back();
  return StringRef(Out.data(), Out.size());
}